

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog.cpp
# Opt level: O0

bool __thiscall QDialogPrivate::canBeNativeDialog(QDialogPrivate *this)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  QPlatformTheme *pQVar4;
  QDialogPrivate *in_RDI;
  int type;
  QDialog *dialog;
  QDialogPrivate *ncThis;
  QDialog *in_stack_ffffffffffffffc8;
  undefined1 local_1;
  
  uVar3 = QCoreApplication::testAttribute(AA_DontUseNativeDialogs);
  if ((uVar3 & 1) == 0) {
    q_func(in_RDI);
    iVar2 = themeDialogType(in_stack_ffffffffffffffc8);
    if (iVar2 < 0) {
      local_1 = false;
    }
    else {
      pQVar4 = QGuiApplicationPrivate::platformTheme();
      bVar1 = (**(code **)(*(long *)pQVar4 + 0x30))(pQVar4,iVar2);
      local_1 = (bool)(bVar1 & 1);
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool QDialogPrivate::canBeNativeDialog() const
{
    if (QCoreApplication::testAttribute(Qt::AA_DontUseNativeDialogs))
        return false;

    QDialogPrivate *ncThis = const_cast<QDialogPrivate *>(this);
    QDialog *dialog = ncThis->q_func();
    const int type = themeDialogType(dialog);
    if (type >= 0)
        return QGuiApplicationPrivate::platformTheme()
                ->usePlatformNativeDialog(static_cast<QPlatformTheme::DialogType>(type));
    return false;
}